

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

void check_function<arg_res_tuple<float,3ul>,float>(arg_res_tuple<float,_3UL> *x_yref,float y)

{
  StringRef capturedExpression;
  __tuple_element_t<0UL,_tuple<float,_float>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<float,_float>_> *p_Var2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ScopedMessage *this;
  MessageBuilder *builder;
  AssertionHandler *this_00;
  MessageBuilder *this_01;
  ostream *this_02;
  MessageBuilder *macroName;
  long in_RDI;
  float in_XMM0_Da;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage0;
  stringstream stream;
  float y_max;
  float y_min;
  tuple<float,_float> y_min_max;
  float y_ref;
  undefined4 in_stack_fffffffffffffc48;
  undefined2 in_stack_fffffffffffffc4c;
  undefined1 in_stack_fffffffffffffc4e;
  undefined1 in_stack_fffffffffffffc4f;
  MessageBuilder *in_stack_fffffffffffffc50;
  AssertionHandler *this_03;
  args<float,_3UL> *in_stack_fffffffffffffc58;
  OfType type;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc60;
  ScopedMessage *this_04;
  undefined4 uVar5;
  float in_stack_fffffffffffffc6c;
  undefined4 uVar6;
  AssertionHandler local_318;
  string local_2b0 [32];
  undefined1 local_290 [228];
  int local_1ac;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  __tuple_element_t<1UL,_tuple<float,_float>_> local_20;
  __tuple_element_t<0UL,_tuple<float,_float>_> local_1c;
  undefined4 local_10;
  float local_c;
  
  local_10 = *(undefined4 *)(in_RDI + 0xc);
  local_c = in_XMM0_Da;
  bounds<float>(in_stack_fffffffffffffc6c);
  p_Var1 = std::get<0ul,float,float>((tuple<float,_float> *)0x3aee33);
  local_1c = *p_Var1;
  p_Var2 = std::get<1ul,float,float>((tuple<float,_float> *)0x3aee4a);
  local_20 = *p_Var2;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = (int)Catch::clara::std::setprecision(7);
  poVar3 = std::operator<<(local_198,(_Setprecision)local_1ac);
  std::operator<<(poVar3,"args: ");
  pbVar4 = operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  type = (OfType)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  this = (ScopedMessage *)std::operator<<((ostream *)pbVar4,"\n");
  builder = (MessageBuilder *)std::operator<<((ostream *)this,"lower bound: ");
  poVar3 = (ostream *)std::ostream::operator<<(builder,local_1c);
  poVar3 = std::operator<<(poVar3,"\n");
  this_00 = (AssertionHandler *)std::operator<<(poVar3,"upper bound: ");
  poVar3 = (ostream *)std::ostream::operator<<(this_00,local_20);
  this_01 = (MessageBuilder *)std::operator<<(poVar3,"\n");
  this_02 = std::operator<<((ostream *)this_01,"actual     : ");
  uVar5 = SUB84(this_02,0);
  uVar6 = (undefined4)((ulong)this_02 >> 0x20);
  std::ostream::operator<<(this_02,local_c);
  local_290._16_16_ =
       (undefined1  [16])
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffc50,
                  CONCAT17(in_stack_fffffffffffffc4f,
                           CONCAT16(in_stack_fffffffffffffc4e,
                                    CONCAT24(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))))
  ;
  this_04 = (ScopedMessage *)local_290;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_04,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
             ,0x79);
  Catch::MessageBuilder::MessageBuilder
            (this_01,(StringRef *)CONCAT44(uVar6,uVar5),(SourceLineInfo *)this_04,type);
  std::__cxx11::stringstream::str();
  macroName = Catch::MessageBuilder::operator<<
                        (in_stack_fffffffffffffc50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc4f,
                                  CONCAT16(in_stack_fffffffffffffc4e,
                                           CONCAT24(in_stack_fffffffffffffc4c,
                                                    in_stack_fffffffffffffc48))));
  Catch::ScopedMessage::ScopedMessage(this,builder);
  std::__cxx11::string::~string(local_2b0);
  Catch::MessageBuilder::~MessageBuilder(in_stack_fffffffffffffc50);
  local_318.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffc50,
                  CONCAT17(in_stack_fffffffffffffc4f,
                           CONCAT16(in_stack_fffffffffffffc4e,
                                    CONCAT24(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))))
  ;
  this_03 = &local_318;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_03,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
             ,0x7a);
  Catch::StringRef::StringRef((StringRef *)this_04,(char *)macroName);
  capturedExpression.m_start._4_4_ = uVar6;
  capturedExpression.m_start._0_4_ = uVar5;
  capturedExpression.m_size = (size_type)this_01;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this_04,(StringRef *)macroName,(SourceLineInfo *)this_03,
             capturedExpression,
             CONCAT13(in_stack_fffffffffffffc4f,
                      CONCAT12(in_stack_fffffffffffffc4e,in_stack_fffffffffffffc4c)));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(local_1c <= local_c && local_c <= local_20,
                      CONCAT16(in_stack_fffffffffffffc4e,
                               CONCAT24(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))),false
            );
  Catch::AssertionHandler::handleExpr<bool>(this_00,(ExprLhs<bool> *)poVar3);
  Catch::AssertionHandler::complete(this_03);
  Catch::AssertionHandler::~AssertionHandler(this_03);
  Catch::ScopedMessage::~ScopedMessage(this_04);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void check_function(const T_ref &x_yref, const T y) {
  const T y_ref{x_yref.y};
  const std::tuple<T, T> y_min_max{bounds(y_ref)};
  const T y_min{std::get<0>(y_min_max)};
  const T y_max{std::get<1>(y_min_max)};
  std::stringstream stream;
  stream << std::setprecision(std::numeric_limits<T>::digits10 + 1)
         << "args: " << x_yref.x << "\n"
         << "lower bound: " << y_min << "\n"
         << "upper bound: " << y_max << "\n"
         << "actual     : " << y;
  INFO(stream.str());
  REQUIRE((y_min <= y and y <= y_max));
}